

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

void __thiscall Graph<Node>::printMinDistMatrix(Graph<Node> *this,ofstream *fout)

{
  ulong uVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  
  std::operator<<((ostream *)fout,"Roy-Floyd distances:\n\n");
  for (lVar3 = 0; uVar1 = (ulong)this->_nodeCnt, lVar3 < (long)uVar1; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 < (int)uVar1; lVar4 = lVar4 + 1) {
      poVar2 = (ostream *)
               std::ostream::operator<<((ostream *)fout,(this->minDist).vect[lVar3].vect[lVar4]);
      std::operator<<(poVar2,' ');
      uVar1 = (ulong)(uint)this->_nodeCnt;
    }
    std::operator<<((ostream *)fout,'\n');
  }
  std::operator<<((ostream *)fout,"------------------------\n\n");
  return;
}

Assistant:

void printMinDistMatrix(std::ofstream &fout) {
        const int Inf = 0x3f3f3f3f;
        fout << "Roy-Floyd distances:\n\n";
        for (int i = 0; i < _nodeCnt; ++i) {
            for (int j = 0; j < _nodeCnt; ++j) {
                fout << minDist[i][j] << ' ';
            }

            fout << '\n';
        }

        fout << "------------------------\n\n";
    }